

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall GEO::Delaunay3d::stellate_cavity(Delaunay3d *this,index_t v)

{
  signed_index_t t1;
  index_t iVar1;
  index_t iVar2;
  index_t local_44;
  index_t local_40;
  index_t neigh3;
  index_t neigh2;
  index_t neigh1;
  index_t f_1;
  signed_index_t v3;
  signed_index_t v2;
  signed_index_t v1;
  index_t t_neigh;
  index_t lf;
  index_t old_tet;
  index_t f;
  index_t new_tet;
  index_t v_local;
  Delaunay3d *this_local;
  
  old_tet = 0xffffffff;
  lf = 0;
  f = v;
  _new_tet = this;
  while( true ) {
    iVar2 = lf;
    iVar1 = Cavity::nb_facets(&this->cavity_);
    if (iVar1 <= iVar2) break;
    t_neigh = Cavity::facet_tet(&this->cavity_,lf);
    v1 = Cavity::facet_facet(&this->cavity_,lf);
    v2 = tet_adjacent(this,t_neigh,v1);
    v3 = Cavity::facet_vertex(&this->cavity_,lf,0);
    f_1 = Cavity::facet_vertex(&this->cavity_,lf,1);
    neigh1 = Cavity::facet_vertex(&this->cavity_,lf,2);
    old_tet = new_tetrahedron(this,f,v3,f_1,neigh1);
    set_tet_adjacent(this,old_tet,0,v2);
    t1 = v2;
    iVar2 = find_tet_adjacent(this,v2,t_neigh);
    set_tet_adjacent(this,t1,iVar2,old_tet);
    Cavity::set_facet_tet(&this->cavity_,lf,old_tet);
    lf = lf + 1;
  }
  neigh2 = 0;
  while( true ) {
    iVar2 = neigh2;
    iVar1 = Cavity::nb_facets(&this->cavity_);
    if (iVar1 <= iVar2) break;
    old_tet = Cavity::facet_tet(&this->cavity_,neigh2);
    Cavity::get_facet_neighbor_tets(&this->cavity_,neigh2,&neigh3,&local_40,&local_44);
    set_tet_adjacent(this,old_tet,1,neigh3);
    set_tet_adjacent(this,old_tet,2,local_40);
    set_tet_adjacent(this,old_tet,3,local_44);
    neigh2 = neigh2 + 1;
  }
  return old_tet;
}

Assistant:

index_t Delaunay3d::stellate_cavity(index_t v) {
	
	index_t new_tet = index_t(-1);
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    index_t old_tet = cavity_.facet_tet(f);
	    index_t lf = cavity_.facet_facet(f);
	    index_t t_neigh = index_t(tet_adjacent(old_tet, lf));
	    signed_index_t v1 = cavity_.facet_vertex(f,0);
	    signed_index_t v2 = cavity_.facet_vertex(f,1);
	    signed_index_t v3 = cavity_.facet_vertex(f,2);
	    new_tet = new_tetrahedron(signed_index_t(v), v1, v2, v3);
	    set_tet_adjacent(new_tet, 0, t_neigh);
	    set_tet_adjacent(t_neigh, find_tet_adjacent(t_neigh,old_tet), new_tet);
	    cavity_.set_facet_tet(f, new_tet);
	}
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    new_tet = cavity_.facet_tet(f);
	    index_t neigh1, neigh2, neigh3;
	    cavity_.get_facet_neighbor_tets(f, neigh1, neigh2, neigh3);
	    set_tet_adjacent(new_tet, 1, neigh1);
	    set_tet_adjacent(new_tet, 2, neigh2);
	    set_tet_adjacent(new_tet, 3, neigh3);		
	}

	return new_tet;
    }